

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_11e5eda::HandleTransformPathCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status,
               function<cmCMakePath_(const_cmCMakePath_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *transform,bool normalizeOption)

{
  long *plVar1;
  cmMakefile *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  _Any_data *p_Var3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  pointer pbVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  pointer pbVar9;
  string_view name;
  string_view name_00;
  string_view name_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view value;
  string inputPath;
  string baseDirectory;
  cmCMakePath path;
  Arguments arguments;
  ArgumentParserWithOutputVariable<Arguments> parser;
  undefined1 local_240 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_218;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  _Any_data *local_1d0;
  _Any_data local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1b8;
  _Any_data *local_1b0;
  char *local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  _Any_data local_188;
  code *local_178;
  undefined8 uStack_170;
  undefined1 local_168;
  _Any_data local_160;
  code *local_150;
  code *local_148 [2];
  code *local_138;
  string local_130;
  char local_110;
  undefined1 local_108 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  ActionMap local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_218 = args;
  local_1d0 = (_Any_data *)transform;
  memset(&local_160,0,0x88);
  local_1c8._8_8_ = 0;
  local_1c8._M_unused._M_member_pointer = 0x30;
  local_1b0 = (_Any_data *)
              std::
              _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
              ::_M_invoke;
  local_1b8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)std::
                 _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
                 ::_M_manager;
  name._M_str = "OUTPUT_VARIABLE";
  name._M_len = 0xf;
  ArgumentParser::Base::Bind((Base *)&local_160,name,(KeywordAction *)&local_1c8);
  if (local_1b8 !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    (*(code *)local_1b8)(&local_1c8,&local_1c8,3);
  }
  local_1c8._8_8_ = 0;
  local_1c8._M_unused._M_member_pointer = 0x58;
  local_1b0 = (_Any_data *)
              std::
              _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
              ::_M_invoke;
  local_1b8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)std::
                 _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
                 ::_M_manager;
  name_00._M_str = "BASE_DIRECTORY";
  name_00._M_len = 0xe;
  ArgumentParser::Base::Bind((Base *)&local_160,name_00,(KeywordAction *)&local_1c8);
  if (local_1b8 !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    (*(code *)local_1b8)(&local_1c8,&local_1c8,3);
  }
  ArgumentParser::ActionMap::ActionMap(&local_b8,(ActionMap *)&local_160);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,&local_f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f0);
  std::
  vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ::~vector((vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
             *)local_108);
  if ((code *)local_130.field_2._8_8_ != (code *)0x0) {
    (*(code *)local_130.field_2._8_8_)(&local_130._M_string_length,&local_130._M_string_length,3);
  }
  if (local_138 != (code *)0x0) {
    (*local_138)((_Any_data *)local_148,(_Any_data *)local_148,__destroy_functor);
  }
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             *)&local_160);
  if (normalizeOption) {
    local_160._8_8_ = 0;
    local_160._M_unused._M_member_pointer = 0x80;
    local_148[0] = std::
                   _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
                   ::_M_invoke;
    local_150 = std::
                _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
                ::_M_manager;
    name_01._M_str = "NORMALIZE";
    name_01._M_len = 9;
    ArgumentParser::Base::Bind((Base *)&local_b8,name_01,(KeywordAction *)&local_160);
    if (local_150 != (code *)0x0) {
      (*local_150)(&local_160,&local_160,3);
    }
  }
  pbVar7 = local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar8 = &(local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar1 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (paVar8 + -1))->_M_dataplus)._M_p;
      if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar1) {
        operator_delete(plVar1,paVar8->_M_allocated_capacity + 1);
      }
      pbVar9 = (pointer)(paVar8 + 1);
      paVar8 = paVar8 + 2;
    } while (pbVar9 != local_48.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar7;
  }
  pvVar2 = local_218;
  local_240._8_8_ =
       (local_218->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_240._0_8_ =
       (local_218->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 2;
  local_148[0] = (code *)(local_160._M_pod_data + 8);
  local_160._8_8_ = local_160._8_8_ & 0xffffffff00000000;
  local_150 = (code *)0x0;
  local_138 = (code *)0x0;
  local_110 = '\0';
  local_f0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = '\0';
  local_f0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = '\0';
  local_1c8._M_unused._M_object = &local_b8;
  local_1a8 = (char *)0x0;
  uStack_1a0 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_188._M_unused._M_object = (void *)0x0;
  local_188._8_8_ = 0;
  local_178 = (code *)0x0;
  uStack_170 = 0;
  local_168 = 0;
  local_1c8._8_8_ = &local_160;
  local_1b8 = &local_48;
  local_1b0 = &local_160;
  local_148[1] = local_148[0];
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)&local_1c8,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_240,0);
  if (local_178 != (code *)0x0) {
    (*local_178)(&local_188,&local_188,__destroy_functor);
  }
  bVar5 = ArgumentParser::ParseResult::MaybeReportError((ParseResult *)&local_160,status->Makefile);
  bVar6 = true;
  if (!bVar5) {
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      local_1f0._M_string_length = 0;
      local_1f0.field_2._M_local_buf[0] = '\0';
      if ((char)local_f0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish != '\x01') {
        cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
      }
      std::__cxx11::string::_M_assign((string *)&local_1f0);
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      local_210._M_string_length = 0;
      local_210.field_2._M_local_buf[0] = '\0';
      bVar6 = getInputPath((pvVar2->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1,status,&local_210);
      p_Var3 = local_1d0;
      if (bVar6) {
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,local_210._M_dataplus._M_p,
                   local_210._M_dataplus._M_p + local_210._M_string_length);
        cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                  ((cmCMakePath *)local_240,&local_d8,generic_format);
        if (*(long *)(p_Var3 + 1) == 0) {
          std::__throw_bad_function_call();
        }
        (**(code **)(p_Var3->_M_pod_data + 0x18))
                  ((cmCMakePath *)&local_1c8,p_Var3,(cmCMakePath *)local_240,&local_1f0);
        std::filesystem::__cxx11::path::~path((path *)local_240);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((char)local_f0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage == '\x01') {
          cmCMakePath::Normal((cmCMakePath *)local_240,(cmCMakePath *)&local_1c8);
          cmCMakePath::operator=((cmCMakePath *)&local_1c8,(cmCMakePath *)local_240);
          std::filesystem::__cxx11::path::~path((path *)local_240);
        }
        cVar4 = local_110;
        this = status->Makefile;
        pbVar7 = (local_218->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_240._0_8_ = (pointer)(local_240 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_240,local_1c8._M_unused._M_object,
                   local_1c8._8_8_ + (long)local_1c8._M_unused._0_8_);
        pbVar7 = pbVar7 + 1;
        if (cVar4 != '\0') {
          pbVar7 = &local_130;
        }
        value._M_str = (char *)local_240._0_8_;
        value._M_len = local_240._8_8_;
        cmMakefile::AddDefinition(this,pbVar7,value);
        if ((pointer)local_240._0_8_ != (pointer)(local_240 + 0x10)) {
          operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
        }
        std::filesystem::__cxx11::path::~path((path *)&local_1c8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,
                        CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                                 local_210.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,
                        CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                                 local_1f0.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      pbVar7 = (pvVar2->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_1c8._8_8_ = pbVar7->_M_dataplus;
      local_1c8._M_unused._0_8_ = (undefined8)pbVar7->_M_string_length;
      local_1b8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x0;
      local_1b0 = (_Any_data *)0x22;
      local_1a8 = " called with unexpected arguments.";
      uStack_1a0 = 0;
      views._M_len = 2;
      views._M_array = (iterator)&local_1c8;
      cmCatViews((string *)local_240,views);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((pointer)local_240._0_8_ != (pointer)(local_240 + 0x10)) {
        operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
      }
      bVar6 = false;
    }
  }
  if ((char)local_f0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
    local_f0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = '\0';
    if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_,(ulong)((long)(unsigned_long *)local_108._16_8_ + 1));
    }
  }
  if (local_110 == '\x01') {
    local_110 = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_160);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ::~vector(&local_b8.Positions.
             super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
           );
  if (local_b8.ParsedKeyword.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_b8.ParsedKeyword.super__Function_base._M_manager)
              ((_Any_data *)&local_b8.ParsedKeyword,(_Any_data *)&local_b8.ParsedKeyword,
               __destroy_functor);
  }
  if (local_b8.KeywordMissingValue.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_b8.KeywordMissingValue.super__Function_base._M_manager)
              ((_Any_data *)&local_b8.KeywordMissingValue,(_Any_data *)&local_b8.KeywordMissingValue
               ,__destroy_functor);
  }
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             *)&local_b8);
  return bVar6;
}

Assistant:

bool HandleTransformPathCommand(
  std::vector<std::string> const& args, cmExecutionStatus& status,
  const std::function<cmCMakePath(const cmCMakePath&,
                                  const std::string& base)>& transform,
  bool normalizeOption = false)
{
  struct Arguments : public ArgumentParser::ParseResult
  {
    cm::optional<ArgumentParser::NonEmpty<std::string>> Output;
    cm::optional<std::string> BaseDirectory;
    bool Normalize = false;
  };

  auto parser = ArgumentParserWithOutputVariable<Arguments>{}.Bind(
    "BASE_DIRECTORY"_s, &Arguments::BaseDirectory);
  if (normalizeOption) {
    parser.Bind("NORMALIZE"_s, &Arguments::Normalize);
  }

  Arguments arguments = parser.Parse(args);

  if (arguments.MaybeReportError(status.GetMakefile())) {
    return true;
  }

  if (!parser.GetInputs().empty()) {
    status.SetError(cmStrCat(args[0], " called with unexpected arguments."));
    return false;
  }

  std::string baseDirectory;
  if (arguments.BaseDirectory) {
    baseDirectory = *arguments.BaseDirectory;
  } else {
    baseDirectory = status.GetMakefile().GetCurrentSourceDirectory();
  }

  std::string inputPath;
  if (!getInputPath(args[1], status, inputPath)) {
    return false;
  }

  auto path = transform(cmCMakePath(inputPath), baseDirectory);
  if (arguments.Normalize) {
    path = path.Normal();
  }

  status.GetMakefile().AddDefinition(
    arguments.Output ? *arguments.Output : args[1], path.String());

  return true;
}